

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

void __thiscall
Messages::Person_PhoneNumber::InternalSwap(Person_PhoneNumber *this,Person_PhoneNumber *other)

{
  uint32 uVar1;
  int iVar2;
  ulong uVar3;
  string *psVar4;
  UnknownFieldSet *other_00;
  Arena *arena;
  bool bVar5;
  
  arena = *(Arena **)&this->field_0x8;
  uVar3 = *(ulong *)&other->field_0x8;
  if (((ulong)arena & 1) == 0) {
    if ((uVar3 & 1) == 0) {
      bVar5 = true;
      goto LAB_001091c5;
    }
LAB_001091a7:
    other_00 = (UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8);
  }
  else {
    if ((uVar3 & 1) != 0) goto LAB_001091a7;
    other_00 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         ((InternalMetadata *)&other->field_0x8);
  }
  google::protobuf::internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
            ((InternalMetadata *)&this->field_0x8,other_00);
  arena = *(Arena **)&this->field_0x8;
  bVar5 = ((ulong)arena & 1) == 0;
LAB_001091c5:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  if (!bVar5) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->number_).ptr_ !=
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->number_).ptr_ !=
      (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar4 = google::protobuf::internal::ArenaStringPtr::Mutable
                       (&this->number_,
                        (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
                        ,arena);
    google::protobuf::internal::ArenaStringPtr::Mutable
              (&other->number_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,arena);
    std::__cxx11::string::swap((string *)psVar4);
  }
  iVar2 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar2;
  return;
}

Assistant:

void Person_PhoneNumber::InternalSwap(Person_PhoneNumber* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  number_.Swap(&other->number_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(type_, other->type_);
}